

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O1

int __thiscall HevcSpsUnit::scaling_list_data(HevcSpsUnit *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  bool local_3d;
  
  uVar6 = 0;
  local_3d = true;
  do {
    uVar4 = 0x10 << ((char)uVar6 * '\x02' & 0x1fU);
    if (0x3f < uVar4) {
      uVar4 = 0x40;
    }
    iVar5 = uVar4 + (uVar4 == 0);
    bVar8 = false;
    uVar4 = 0;
    do {
      bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
      if (bVar1) {
        iVar7 = iVar5;
        if (1 < uVar6) {
          uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
          uVar3 = uVar2 + 1 >> 1;
          if ((uVar2 & 1) == 0) {
            uVar3 = -(uVar2 >> 1);
          }
          if (0xfe < uVar3 + 7) goto LAB_0018b101;
        }
        do {
          uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
          uVar3 = uVar2 + 1 >> 1;
          if ((uVar2 & 1) == 0) {
            uVar3 = -(uVar2 >> 1);
          }
          if ((int)(char)uVar3 != uVar3) goto LAB_0018b101;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      else {
        uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
        if (5 < uVar3) {
LAB_0018b101:
          if (!bVar8) goto LAB_0018b121;
          break;
        }
      }
      uVar4 = uVar4 + (uint)(uVar6 == 3) * 2 + 1;
      bVar8 = uVar4 >= 6;
    } while (uVar4 < 6);
    local_3d = uVar6 < 3;
    uVar6 = uVar6 + 1;
    if (uVar6 == 4) {
LAB_0018b121:
      return (uint)local_3d;
    }
  } while( true );
}

Assistant:

int HevcSpsUnit::scaling_list_data()
{
    for (int sizeId = 0; sizeId < 4; sizeId++)
    {
        for (int matrixId = 0; matrixId < 6; matrixId += (sizeId == 3) ? 3 : 1)
        {
            if (!m_reader.getBit())
            {
                if (extractUEGolombCode() > 5)  // scaling_list_pred_matrix_id_delta
                    return 1;
            }
            else
            {
                const int coefNum = FFMIN(64, (1 << (4 + (sizeId << 1))));
                if (sizeId > 1)
                {
                    const int scaling_list_dc_coef = extractSEGolombCode() + 8;
                    if (scaling_list_dc_coef < 1 || scaling_list_dc_coef > 255)
                        return 1;
                }
                for (int i = 0; i < coefNum; i++)
                {
                    const int scaling_list_delta_coef = extractSEGolombCode();
                    if (scaling_list_delta_coef < -128 || scaling_list_delta_coef > 127)
                        return 1;
                }
            }
        }
    }
    return 0;
}